

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu.cpp
# Opt level: O0

void __thiscall
geemuboi::test::core::CpuTest_add_hl_sp_Test::~CpuTest_add_hl_sp_Test(CpuTest_add_hl_sp_Test *this)

{
  CpuTest_add_hl_sp_Test *this_local;
  
  ~CpuTest_add_hl_sp_Test(this);
  operator_delete(this,0x150);
  return;
}

Assistant:

TEST_F(CpuTest, add_hl_sp) {
    regs.f = ICpu::Z_FLAG;
    regs.h = 1;
    regs.l = 2;
    regs.sp = 0x0102;
    execute_instruction(0x39);

    ICpu::Registers expected_regs{};
    expected_regs.sp = 0x0102;
    expected_regs.h = 2;
    expected_regs.l = 4;
    expected_regs.f = ICpu::Z_FLAG;
    expected_regs.pc = 1;
    verify_state_changes(expected_regs);

    EXPECT_EQ(cpu->get_cycles_executed(), 2);
}